

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O0

char * optimal_encoding_export(_encode_match_data *emd)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  encode_match_privp data;
  char *p;
  interval_nodep *offsets;
  _encode_match_data *emd_local;
  
  puVar1 = *(undefined8 **)((long)emd->priv + 0x28);
  pcVar4 = export_helper(*(interval_nodep *)((long)emd->priv + 0x30),0x10);
  iVar2 = sprintf(optimal_encoding_export::buf,"%s",pcVar4);
  pcVar4 = optimal_encoding_export::buf + iVar2;
  pcVar5 = export_helper((interval_nodep)*puVar1,4);
  iVar2 = sprintf(pcVar4,",%s",pcVar5);
  pcVar5 = export_helper((interval_nodep)puVar1[1],0x10);
  iVar3 = sprintf(pcVar4 + iVar2,",%s",pcVar5);
  pcVar5 = export_helper((interval_nodep)puVar1[7],0x10);
  sprintf(pcVar4 + iVar2 + iVar3,",%s",pcVar5);
  return optimal_encoding_export::buf;
}

Assistant:

const char *optimal_encoding_export(encode_match_data emd)
{
    interval_nodep *offsets;
    static char buf[100];
    char *p = buf;
    encode_match_privp data;
    data = emd->priv;
    offsets = (interval_nodep*)data->offset_f_priv;
    p += sprintf(p, "%s", export_helper((interval_nodep)data->len_f_priv, 16));
    p += sprintf(p, ",%s", export_helper(offsets[0], 4));
    p += sprintf(p, ",%s", export_helper(offsets[1], 16));
    p += sprintf(p, ",%s", export_helper(offsets[7], 16));
    return buf;
}